

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sutils.h
# Opt level: O0

string * rtrim(string *__return_storage_ptr__,string *str)

{
  allocator<char> local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_38;
  string *local_18;
  string *str_local;
  
  local_18 = str;
  str_local = __return_storage_ptr__;
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&local_38,"\\s+$",0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_59);
  std::
  regex_replace<std::__cxx11::regex_traits<char>,char,std::char_traits<char>,std::allocator<char>,std::char_traits<char>,std::allocator<char>>
            (__return_storage_ptr__,str,&local_38,&local_58,0);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_38);
  return __return_storage_ptr__;
}

Assistant:

string rtrim(const string& str) {
    return regex_replace(str, regex("\\s+$"), string(""));
}